

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratePluginOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,string *plugin_name,string *parameter,GeneratorContext *generator_context,
          string *error)

{
  pointer ppFVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  Version *this_00;
  size_type sVar5;
  mapped_type *program;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  long lVar7;
  pointer __old_p;
  int i;
  ulong uVar8;
  SubstituteArg *in_stack_fffffffffffffc78;
  Subprocess subprocess;
  string communicate_error;
  string processed_parameter;
  string local_310;
  CodeGeneratorResponse response;
  CodeGeneratorRequest request;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  CodedOutputStream writer;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  ZeroCopyOutputStream *stream;
  
  CodeGeneratorRequest::CodeGeneratorRequest(&request);
  CodeGeneratorResponse::CodeGeneratorResponse(&response);
  std::__cxx11::string::string((string *)&processed_parameter,(string *)parameter);
  if (processed_parameter._M_string_length != 0) {
    CodeGeneratorRequest::_internal_set_parameter(&request,&processed_parameter);
  }
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &already_seen._M_t._M_impl.super__Rb_tree_header._M_header;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar8 = 0;
      ppFVar1 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(parsed_files->
                            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      uVar8 = uVar8 + 1) {
    CodeGeneratorRequest::add_file_to_generate(&request,*(string **)ppFVar1[uVar8]);
    GetTransitiveDependencies
              ((parsed_files->
               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar8],true,true,&already_seen,
               &request.proto_file_);
  }
  this_00 = CodeGeneratorRequest::_internal_mutable_compiler_version(&request);
  this_00->major_ = 3;
  this_00->minor_ = 9;
  *(byte *)(this_00->_has_bits_).has_bits_ = (byte)(this_00->_has_bits_).has_bits_[0] | 0xe;
  this_00->patch_ = 1;
  Version::set_suffix(this_00,"");
  Subprocess::Subprocess(&subprocess);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->plugins_,plugin_name);
  program = plugin_name;
  if (sVar5 != 0) {
    program = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->plugins_,plugin_name);
  }
  Subprocess::Start(&subprocess,program,(uint)(sVar5 != 0));
  communicate_error._M_dataplus._M_p = (pointer)&communicate_error.field_2;
  communicate_error._M_string_length = 0;
  communicate_error.field_2._M_local_buf[0] = '\0';
  bVar3 = Subprocess::Communicate
                    (&subprocess,&request.super_Message,&response.super_Message,&communicate_error);
  if (bVar3) {
    stream = (ZeroCopyOutputStream *)0x0;
    for (lVar6 = 0; lVar6 < response.file_.super_RepeatedPtrFieldBase.current_size_;
        lVar6 = lVar6 + 1) {
      pvVar2 = (response.file_.super_RepeatedPtrFieldBase.rep_)->elements[lVar6];
      if (*(long *)(*(long *)((long)pvVar2 + 0x20) + 8) == 0) {
        lVar7 = *(long *)((long)pvVar2 + 0x18);
        if (*(long *)(lVar7 + 8) == 0) {
          if (stream == (ZeroCopyOutputStream *)0x0) {
            writer.impl_.end_ = (uint8 *)(plugin_name->_M_dataplus)._M_p;
            writer.impl_.buffer_end_._0_4_ = (undefined4)plugin_name->_M_string_length;
            local_60.text_ = (pointer)0x0;
            local_60.size_ = -1;
            local_90.text_ = (char *)0x0;
            local_90.size_ = -1;
            local_c0.text_ = (char *)0x0;
            local_c0.size_ = -1;
            local_f0.text_ = (char *)0x0;
            local_f0.size_ = -1;
            local_120.text_ = (char *)0x0;
            local_120.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_180.text_ = (char *)0x0;
            local_180.size_ = -1;
            local_1b0.text_ = (char *)0x0;
            local_1b0.size_ = -1;
            local_1e0.text_ = (char *)0x0;
            local_1e0.size_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_310,
                       (strings *)
                       "$0: First file chunk returned by plugin did not specify a file name.",
                       (char *)&writer,&local_60,&local_90,&local_c0,&local_f0,&local_120,&local_150
                       ,&local_180,&local_1b0,&local_1e0,in_stack_fffffffffffffc78);
            goto LAB_0026ebd0;
          }
        }
        else {
          if (stream != (ZeroCopyOutputStream *)0x0) {
            (*stream->_vptr_ZeroCopyOutputStream[1])(stream);
            lVar7 = *(long *)((long)pvVar2 + 0x18);
          }
          iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,lVar7);
          stream = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar4);
        }
      }
      else {
        std::__cxx11::string::string((string *)&writer,*(string **)((long)pvVar2 + 0x18));
        if (stream != (ZeroCopyOutputStream *)0x0) {
          (*stream->_vptr_ZeroCopyOutputStream[1])(stream);
        }
        iVar4 = (*generator_context->_vptr_GeneratorContext[4])
                          (generator_context,&writer,*(undefined8 *)((long)pvVar2 + 0x20));
        stream = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
        std::__cxx11::string::~string((string *)&writer);
      }
      io::CodedOutputStream::CodedOutputStream(&writer,stream);
      io::CodedOutputStream::WriteString(&writer,*(string **)((long)pvVar2 + 0x28));
      io::CodedOutputStream::~CodedOutputStream(&writer);
    }
    bVar3 = (response.error_.ptr_)->_M_string_length == 0;
    if (!bVar3) {
      std::__cxx11::string::_M_assign((string *)error);
    }
    if (stream != (ZeroCopyOutputStream *)0x0) {
      (*stream->_vptr_ZeroCopyOutputStream[1])(stream);
    }
  }
  else {
    writer.impl_.end_ = (uint8 *)(plugin_name->_M_dataplus)._M_p;
    writer.impl_.buffer_end_._0_4_ = (undefined4)plugin_name->_M_string_length;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_60.text_ = communicate_error._M_dataplus._M_p;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_60.size_ = (int)communicate_error._M_string_length;
    local_1e0.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_310,(strings *)"$0: $1",(char *)&writer,&local_60,&local_90,&local_c0,
               &local_f0,&local_120,&local_150,&local_180,&local_1b0,&local_1e0,
               in_stack_fffffffffffffc78);
LAB_0026ebd0:
    std::__cxx11::string::operator=((string *)error,(string *)&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&communicate_error);
  Subprocess::~Subprocess(&subprocess);
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree(&already_seen._M_t);
  std::__cxx11::string::~string((string *)&processed_parameter);
  CodeGeneratorResponse::~CodeGeneratorResponse(&response);
  CodeGeneratorRequest::~CodeGeneratorRequest(&request);
  return bVar3;
}

Assistant:

bool CommandLineInterface::GeneratePluginOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const std::string& plugin_name, const std::string& parameter,
    GeneratorContext* generator_context, std::string* error) {
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;
  std::string processed_parameter = parameter;


  // Build the request.
  if (!processed_parameter.empty()) {
    request.set_parameter(processed_parameter);
  }


  std::set<const FileDescriptor*> already_seen;
  for (int i = 0; i < parsed_files.size(); i++) {
    request.add_file_to_generate(parsed_files[i]->name());
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name for plugins.
                              true,  // Include source code info.
                              &already_seen, request.mutable_proto_file());
  }

  google::protobuf::compiler::Version* version =
      request.mutable_compiler_version();
  version->set_major(PROTOBUF_VERSION / 1000000);
  version->set_minor(PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(PROTOBUF_VERSION % 1000);
  version->set_suffix(PROTOBUF_VERSION_SUFFIX);

  // Invoke the plugin.
  Subprocess subprocess;

  if (plugins_.count(plugin_name) > 0) {
    subprocess.Start(plugins_[plugin_name], Subprocess::EXACT_NAME);
  } else {
    subprocess.Start(plugin_name, Subprocess::SEARCH_PATH);
  }

  std::string communicate_error;
  if (!subprocess.Communicate(request, &response, &communicate_error)) {
    *error = strings::Substitute("$0: $1", plugin_name, communicate_error);
    return false;
  }

  // Write the files.  We do this even if there was a generator error in order
  // to match the behavior of a compiled-in generator.
  std::unique_ptr<io::ZeroCopyOutputStream> current_output;
  for (int i = 0; i < response.file_size(); i++) {
    const CodeGeneratorResponse::File& output_file = response.file(i);

    if (!output_file.insertion_point().empty()) {
      std::string filename = output_file.name();
      // Open a file for insert.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->OpenForInsert(
          filename, output_file.insertion_point()));
    } else if (!output_file.name().empty()) {
      // Starting a new file.  Open it.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->Open(output_file.name()));
    } else if (current_output == NULL) {
      *error = strings::Substitute(
          "$0: First file chunk returned by plugin did not specify a file "
          "name.",
          plugin_name);
      return false;
    }

    // Use CodedOutputStream for convenience; otherwise we'd need to provide
    // our own buffer-copying loop.
    io::CodedOutputStream writer(current_output.get());
    writer.WriteString(output_file.content());
  }

  // Check for errors.
  if (!response.error().empty()) {
    // Generator returned an error.
    *error = response.error();
    return false;
  }

  return true;
}